

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

uint32_t __thiscall Jinx::Impl::Parser::GetOperatorPrecedence(Parser *this,Opcode opcode)

{
  switch(opcode) {
  case Add:
    return 2;
  case And:
switchD_0011fec6_caseD_1e:
    return 4;
  case CallFunc:
  case Cast:
  case Decrement:
  case EraseItr:
  case ErasePropKeyVal:
  case EraseVarKeyVal:
  case Exit:
  case Function:
    goto switchD_0011fec6_caseD_16;
  case Divide:
switchD_0011fec6_caseD_19:
    return 1;
  case Equals:
  case Greater:
  case GreaterEq:
switchD_0011fec6_caseD_14:
    return 3;
  default:
    switch(opcode) {
    case Less:
    case LessEq:
    case NotEquals:
      goto switchD_0011fec6_caseD_14;
    case Library:
    case LoopCount:
    case LoopOver:
    case Negate:
    case Not:
      break;
    case Mod:
    case Multiply:
      goto switchD_0011fec6_caseD_19;
    case Or:
      goto switchD_0011fec6_caseD_1e;
    default:
      if (opcode == Subtract) {
        return 2;
      }
    }
switchD_0011fec6_caseD_16:
    __assert_fail("!\"Unknown opcode used in binary expression\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                  ,0xbb,"uint32_t Jinx::Impl::Parser::GetOperatorPrecedence(Opcode) const");
  }
}

Assistant:

inline_t uint32_t Parser::GetOperatorPrecedence(Opcode opcode) const
	{
		// Lower values mean higher precedence
		switch (opcode)
		{
		case Opcode::Multiply: return 1;
		case Opcode::Divide: return 1;
		case Opcode::Mod: return 1;
		case Opcode::Add: return 2;
		case Opcode::Subtract: return 2;
		case Opcode::Less: return 3;
		case Opcode::LessEq: return 3;
		case Opcode::Greater: return 3;
		case Opcode::GreaterEq: return 3;
		case Opcode::Equals: return 3;
		case Opcode::NotEquals: return 3;
		case Opcode::And: return 4;
		case Opcode::Or: return 4;
		default:
			assert(!"Unknown opcode used in binary expression");
			return 0;
		};
	}